

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeLocation.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::XIncludeLocation::prependPath(XIncludeLocation *this,XMLCh *baseToAdd)

{
  int iVar1;
  int iVar2;
  XMLSize_t XVar3;
  XMLCh *src;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  XMLCh *target;
  
  if (this->fHref != (XMLCh *)0x0) {
    if (baseToAdd == (XMLCh *)0x0) {
      return this->fHref;
    }
    XMLPlatformUtils::removeDotDotSlash(baseToAdd,XMLPlatformUtils::fgMemoryManager);
    XVar3 = XMLString::stringLen(baseToAdd);
    iVar1 = XMLString::lastIndexOf(baseToAdd,L'/');
    if (iVar1 == -1) {
      iVar1 = XMLString::lastIndexOf(baseToAdd,L'\\');
    }
    src = findEndOfProtocol(this->fHref);
    XVar4 = XMLString::stringLen(src);
    iVar2 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                      (XMLPlatformUtils::fgMemoryManager,(XVar4 + XVar3) * 2 + 4);
    target = (XMLCh *)CONCAT44(extraout_var,iVar2);
    if (target != (XMLCh *)0x0) {
      XMLString::copyNString(target,baseToAdd,(long)iVar1 + 1);
      target[(long)iVar1 + 1] = L'\0';
      XMLString::catString(target,src);
      deallocate(this->fHref);
      this->fHref = target;
      return target;
    }
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh *
XIncludeLocation::prependPath(const XMLCh *baseToAdd){
    XMLCh *relativeHref = NULL;
    if (fHref == NULL){
        return NULL;
    }

    if (baseToAdd == NULL){
        return fHref;
    }

    XMLPlatformUtils::removeDotDotSlash((XMLCh*)baseToAdd);
    XMLSize_t baseLength = XMLString::stringLen(baseToAdd);

    int lastSlash = XMLString::lastIndexOf(baseToAdd, chForwardSlash);
    if (lastSlash == -1){
        /* not found, try another platform */
        lastSlash = XMLString::lastIndexOf(baseToAdd, chBackSlash);
    }

    // Skip the scheme (e.g., file://) if fHref has one. Ideally we
    // should detect also if the URI is absolute.
    //
    const XMLCh* hrefPath = findEndOfProtocol (fHref);
    XMLSize_t hrefPathLength = XMLString::stringLen(hrefPath);

    relativeHref = (XMLCh *)XMLPlatformUtils::fgMemoryManager->allocate((hrefPathLength + baseLength + 2) * sizeof(XMLCh));
    if (relativeHref == NULL){
        return NULL;
    }
    XMLString::copyNString(relativeHref, baseToAdd, lastSlash + 1);
    relativeHref[lastSlash + 1] = chNull;
    XMLString::catString(relativeHref, hrefPath);

    /* free the old reference */
    deallocate((void *)fHref);

    fHref = relativeHref;
    return fHref;
}